

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O2

Scene * book_cover(void)

{
  double dVar1;
  Point3 look_from;
  Point3 look_at;
  shared_ptr<Dielectric> *psVar2;
  value_type *pvVar3;
  int iVar4;
  Scene *in_RDI;
  int iVar5;
  shared_ptr<Metal> material3;
  shared_ptr<Lambertian> material2;
  double fuzz;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_240 [2];
  int local_22c;
  ObjectList objects;
  shared_ptr<Dielectric> material1;
  undefined1 local_1f0 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_1e0;
  value_type local_1d8;
  value_type local_1c8;
  Scene *local_1b8;
  double local_1b0;
  double local_1a8;
  double local_1a0;
  shared_ptr<Lambertian> ground_mat;
  value_type local_128;
  value_type local_118;
  value_type local_108;
  value_type local_f8;
  Camera camera;
  
  objects.super_Object._vptr_Object = (_func_int **)&PTR_hit_00112b20;
  objects.objects_.
  super__Vector_base<std::shared_ptr<Object>,_std::allocator<std::shared_ptr<Object>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  objects.objects_.
  super__Vector_base<std::shared_ptr<Object>,_std::allocator<std::shared_ptr<Object>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  objects.objects_.
  super__Vector_base<std::shared_ptr<Object>,_std::allocator<std::shared_ptr<Object>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  camera.origin_.e[0] = 0.5;
  camera.origin_.e[1] = 0.5;
  camera.origin_.e[2] = 0.5;
  std::make_shared<Lambertian,Vec3>((Vec3 *)&ground_mat);
  camera.origin_.e[0] = 0.0;
  camera.origin_.e[1] = -1000.0;
  camera.origin_.e[2] = 0.0;
  material2.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       CONCAT44(material2.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_,
                1000);
  std::make_shared<Sphere,Vec3,int,std::shared_ptr<Lambertian>&>
            ((Vec3 *)&material1,(int *)&camera,&material2);
  local_f8.super___shared_ptr<Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)material1.super___shared_ptr<Dielectric,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_f8.super___shared_ptr<Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       material1.super___shared_ptr<Dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  material1.super___shared_ptr<Dielectric,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  material1.super___shared_ptr<Dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_1b8 = in_RDI;
  std::vector<std::shared_ptr<Object>,_std::allocator<std::shared_ptr<Object>_>_>::push_back
            (&objects.objects_,&local_f8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_f8.super___shared_ptr<Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&material1.super___shared_ptr<Dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  iVar4 = -0xb;
  do {
    if (iVar4 == 0xb) {
      camera.origin_.e[0] = 1.5;
      std::make_shared<Dielectric,double>((double *)&material1);
      camera.origin_.e[0] = 0.0;
      camera.origin_.e[1] = 1.0;
      camera.origin_.e[2] = 0.0;
      material3.super___shared_ptr<Metal,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x3ff0000000000000;
      std::make_shared<Sphere,Vec3,double,std::shared_ptr<Dielectric>&>
                ((Vec3 *)&material2,(double *)&camera,(shared_ptr<Dielectric> *)&material3);
      local_108.super___shared_ptr<Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           material2.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_108.super___shared_ptr<Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           material2.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      material2.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      material2.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      std::vector<std::shared_ptr<Object>,_std::allocator<std::shared_ptr<Object>_>_>::push_back
                (&objects.objects_,&local_108);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_108.super___shared_ptr<Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&material2.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      camera.origin_.e[0] = 0.4;
      camera.origin_.e[1] = 0.2;
      camera.origin_.e[2] = 0.1;
      std::make_shared<Lambertian,Vec3>((Vec3 *)&material2);
      camera.origin_.e[0] = -4.0;
      camera.origin_.e[1] = 1.0;
      camera.origin_.e[2] = 0.0;
      fuzz = 1.0;
      std::make_shared<Sphere,Vec3,double,std::shared_ptr<Lambertian>&>
                ((Vec3 *)&material3,(double *)&camera,(shared_ptr<Lambertian> *)&fuzz);
      local_118.super___shared_ptr<Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)material3.super___shared_ptr<Metal,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_118.super___shared_ptr<Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           material3.super___shared_ptr<Metal,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      material3.super___shared_ptr<Metal,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
      material3.super___shared_ptr<Metal,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      std::vector<std::shared_ptr<Object>,_std::allocator<std::shared_ptr<Object>_>_>::push_back
                (&objects.objects_,&local_118);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_118.super___shared_ptr<Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&material3.super___shared_ptr<Metal,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      camera.origin_.e[0] = 0.7;
      camera.origin_.e[1] = 0.6;
      camera.origin_.e[2] = 0.5;
      fuzz = 0.0;
      std::make_shared<Metal,Vec3,double>((Vec3 *)&material3,(double *)&camera);
      camera.origin_.e[0] = 4.0;
      camera.origin_.e[1] = 1.0;
      camera.origin_.e[2] = 0.0;
      local_1f0._0_8_ = (element_type *)0x3ff0000000000000;
      std::make_shared<Sphere,Vec3,double,std::shared_ptr<Metal>&>
                ((Vec3 *)&fuzz,(double *)&camera,(shared_ptr<Metal> *)local_1f0);
      local_128.super___shared_ptr<Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)fuzz
      ;
      local_128.super___shared_ptr<Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           a_Stack_240[0]._M_pi;
      fuzz = 0.0;
      a_Stack_240[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      std::vector<std::shared_ptr<Object>,_std::allocator<std::shared_ptr<Object>_>_>::push_back
                (&objects.objects_,&local_128);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_128.super___shared_ptr<Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_240);
      look_from.e[1] = 2.0;
      look_from.e[0] = 10.0;
      look_from.e[2] = -5.0;
      look_at.e[2] = 0.0;
      look_at.e[0] = 0.0;
      look_at.e[1] = 0.0;
      Camera::Camera(&camera,look_from,look_at,(Vec3)(ZEXT824(0x3ff0000000000000) << 0x40),30.0,
                     1.7777777777777777,0.1,10.0);
      ObjectList::ObjectList(&local_1b8->objects_,&objects);
      memcpy(&local_1b8->camera_,&camera,0xb0);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&material3.super___shared_ptr<Metal,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&material2.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&material1.super___shared_ptr<Dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&ground_mat.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
      ;
      ObjectList::~ObjectList(&objects);
      return local_1b8;
    }
    local_1b0 = (double)iVar4;
    local_22c = iVar4;
    for (iVar5 = -0xb; iVar5 != 0xb; iVar5 = iVar5 + 1) {
      local_1a8 = nrand();
      local_1a0 = nrand();
      dVar1 = nrand();
      camera.origin_.e[0] = local_1a0 * 0.9 + local_1b0;
      camera.origin_.e[2] = dVar1 * 0.9 + (double)iVar5;
      camera.origin_.e[1] = 0.2;
      if (2.0 < SQRT(camera.origin_.e[2] * camera.origin_.e[2] +
                     (camera.origin_.e[0] + -4.0) * (camera.origin_.e[0] + -4.0) + 0.0)) {
        if (0.8 <= local_1a8) {
          if (local_1a8 < 0.95) {
            Vec3::random();
            dVar1 = nrand();
            fuzz = dVar1 * 0.5 + 0.0;
            std::make_shared<Metal,Vec3&,double&>((Vec3 *)&material2,(double *)&material1);
            local_1f0._0_8_ = (element_type *)0x3fc999999999999a;
            std::make_shared<Sphere,Vec3&,double,std::shared_ptr<Metal>&>
                      ((Vec3 *)&material3,(double *)&camera,(shared_ptr<Metal> *)local_1f0);
            local_1d8.super___shared_ptr<Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)
                 material3.super___shared_ptr<Metal,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            local_1d8.super___shared_ptr<Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                 material3.super___shared_ptr<Metal,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
            material3.super___shared_ptr<Metal,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)0x0;
            material3.super___shared_ptr<Metal,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            std::vector<std::shared_ptr<Object>,_std::allocator<std::shared_ptr<Object>_>_>::
            push_back(&objects.objects_,&local_1d8);
            pvVar3 = &local_1d8;
            goto LAB_0010ab24;
          }
          material2.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x3ff8000000000000;
          std::make_shared<Dielectric,double>((double *)&material1);
          material3.super___shared_ptr<Metal,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x3fc999999999999a;
          std::make_shared<Sphere,Vec3&,double,std::shared_ptr<Dielectric>&>
                    ((Vec3 *)&material2,(double *)&camera,(shared_ptr<Dielectric> *)&material3);
          local_1f0._8_8_ =
               material2.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          _Stack_1e0._M_pi =
               material2.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
          material2.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          material2.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          std::vector<std::shared_ptr<Object>,_std::allocator<std::shared_ptr<Object>_>_>::push_back
                    (&objects.objects_,(value_type *)(local_1f0 + 8));
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_1e0);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&material2.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          psVar2 = &material1;
        }
        else {
          Vec3::random();
          std::make_shared<Lambertian,Vec3&>((Vec3 *)&material2);
          fuzz = 0.2;
          std::make_shared<Sphere,Vec3&,double,std::shared_ptr<Lambertian>&>
                    ((Vec3 *)&material3,(double *)&camera,(shared_ptr<Lambertian> *)&fuzz);
          local_1c8.super___shared_ptr<Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)
               material3.super___shared_ptr<Metal,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_1c8.super___shared_ptr<Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               material3.super___shared_ptr<Metal,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
          material3.super___shared_ptr<Metal,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          material3.super___shared_ptr<Metal,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          std::vector<std::shared_ptr<Object>,_std::allocator<std::shared_ptr<Object>_>_>::push_back
                    (&objects.objects_,&local_1c8);
          pvVar3 = &local_1c8;
LAB_0010ab24:
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&(pvVar3->super___shared_ptr<Object,_(__gnu_cxx::_Lock_policy)2>)._M_refcount);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&material3.super___shared_ptr<Metal,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
          psVar2 = (shared_ptr<Dielectric> *)&material2;
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&((__shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2> *)
                    &psVar2->super___shared_ptr<Dielectric,_(__gnu_cxx::_Lock_policy)2>)->
                    _M_refcount);
      }
    }
    iVar4 = local_22c + 1;
  } while( true );
}

Assistant:

Scene book_cover() {

  ObjectList objects;

  auto ground_mat = std::make_shared<Lambertian>(Color(0.5, 0.5, 0.5));
  objects.add(std::make_shared<Sphere>(Point3(0, -1000, 0), 1000, ground_mat));

  for (int a = -11; a < 11; a++) {
    for (int b = -11; b < 11; b++) {
      auto choose_mat = nrand();
      Point3 center{a + 0.9*nrand(), 0.2, b + 0.9*nrand()};

      if ((center - Vec3(4, 0.2, 0)).length() > 2.0) {
        if (choose_mat < 0.8) {
          Color albedo = Color::random(0, 1);
          auto sphere_material = std::make_shared<Lambertian>(albedo);
          objects.add(std::make_shared<Sphere>(center, 0.2, sphere_material));
        } else if (choose_mat < 0.95) {
          auto albedo = Color::random(0.5, 1);
          auto fuzz = nrand(0, 0.5);
          auto sphere_material = std::make_shared<Metal>(albedo, fuzz);
          objects.add(std::make_shared<Sphere>(center, 0.2, sphere_material));
        } else {
          // glass
          auto sphere_material = std::make_shared<Dielectric>(1.5);
          objects.add(std::make_shared<Sphere>(center, 0.2, sphere_material));
        }
      }
    }
  }

  auto material1 = std::make_shared<Dielectric>(1.5);
  objects.add(std::make_shared<Sphere>(Point3(0, 1, 0), 1.0, material1));

  auto material2 = std::make_shared<Lambertian>(Color(0.4, 0.2, 0.1));
  objects.add(std::make_shared<Sphere>(Point3(-4, 1, 0), 1.0, material2));

  auto material3 = std::make_shared<Metal>(Color(0.7, 0.6, 0.5), 0.0);
  objects.add(std::make_shared<Sphere>(Point3(4, 1, 0), 1.0, material3));

  // Setup camera
  Point3 camera_position{10, 2, -5};
  Point3 camera_target{0, 0, 0};
  double field_of_view = 30;
  double aperture = 0.1;
  double focal_dist = 10.0;

  Camera camera(camera_position,
                camera_target,
                Point3(0, 1, 0),
                field_of_view,
                ASPECT_RATIO,
                aperture,
                10.0);
  return {objects, camera};
}